

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O3

void __thiscall
soul::ResolutionPass::TypeResolver::resolveVariableDeclarationInitialValue
          (TypeResolver *this,VariableDeclaration *v,Type *type)

{
  size_t *psVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  TypeCast *pTVar5;
  Expression *pEVar6;
  Allocator *this_00;
  Type local_40;
  
  pEVar6 = (v->initialValue).object;
  if (pEVar6 == (Expression *)0x0) {
    return;
  }
  if (pEVar6->kind == value) {
    iVar3 = (*(pEVar6->super_Statement).super_ASTObject._vptr_ASTObject[3])(pEVar6);
    if ((char)iVar3 == '\0') {
      pEVar6 = (v->initialValue).object;
      if (pEVar6 == (Expression *)0x0) {
        return;
      }
      goto LAB_00210c1c;
    }
    pEVar6 = (v->initialValue).object;
    if (pEVar6 == (Expression *)0x0) goto LAB_00210cf6;
    (*(pEVar6->super_Statement).super_ASTObject._vptr_ASTObject[4])(&local_40);
    bVar2 = Type::isEqual(&local_40,type,0);
    RefCountedPtr<soul::Structure>::decIfNotNull(local_40.structure.object);
    if (bVar2) goto LAB_00210c5a;
    pEVar6 = (v->initialValue).object;
    if (pEVar6 == (Expression *)0x0) goto LAB_00210cf6;
    SanityCheckPass::expectSilentCastPossible
              (&(pEVar6->super_Statement).super_ASTObject.context,type,pEVar6);
    pEVar6 = (v->initialValue).object;
    if (pEVar6 == (Expression *)0x0) goto LAB_00210cf6;
    this_00 = (this->super_ErrorIgnoringRewritingASTVisitor).allocator;
  }
  else {
LAB_00210c1c:
    lVar4 = __dynamic_cast(pEVar6,&AST::Expression::typeinfo,&AST::CommaSeparatedList::typeinfo,0);
    if (lVar4 == 0) {
      return;
    }
    if (pEVar6 == (Expression *)0x0) {
LAB_00210cf6:
      throwInternalCompilerError("object != nullptr","operator->",0x3c);
    }
    this_00 = (this->super_ErrorIgnoringRewritingASTVisitor).allocator;
  }
  pTVar5 = PoolAllocator::
           allocate<soul::AST::TypeCast,soul::AST::Context&,soul::Type_const&,soul::AST::Expression&>
                     (&this_00->pool,&(pEVar6->super_Statement).super_ASTObject.context,type,pEVar6)
  ;
  (v->initialValue).object = &pTVar5->super_Expression;
LAB_00210c5a:
  (v->declaredType).object = (Expression *)0x0;
  psVar1 = &(this->super_ErrorIgnoringRewritingASTVisitor).super_RewritingASTVisitor.itemsReplaced;
  *psVar1 = *psVar1 + 1;
  return;
}

Assistant:

void resolveVariableDeclarationInitialValue (AST::VariableDeclaration& v, const Type& type)
        {
            if (AST::isResolvedAsValue (v.initialValue))
            {
                if (! v.initialValue->getResultType().isIdentical (type))
                {
                    SanityCheckPass::expectSilentCastPossible (v.initialValue->context, type, *v.initialValue);
                    v.initialValue = allocator.allocate<AST::TypeCast> (v.initialValue->context, type, *v.initialValue);
                }

                v.declaredType = {};
                ++itemsReplaced;
            }
            else if (is_type<AST::CommaSeparatedList> (v.initialValue))
            {
                v.initialValue = allocator.allocate<AST::TypeCast> (v.initialValue->context, type, *v.initialValue);
                v.declaredType = {};
                ++itemsReplaced;
            }
        }